

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_dup_i32_vec_ppc64(TCGContext_conflict10 *tcg_ctx,uint vece,TCGv_vec r,TCGv_i32 a)

{
  TCGArg a_00;
  TCGArg a_01;
  TCGTemp *pTVar1;
  TCGType type;
  TCGTemp *rt;
  TCGArg ai;
  TCGArg ri;
  TCGv_i32 a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  a_00 = tcgv_vec_arg(tcg_ctx,r);
  a_01 = tcgv_i32_arg(tcg_ctx,a);
  pTVar1 = arg_temp(a_00);
  vec_gen_2_ppc64(tcg_ctx,INDEX_op_dup_vec,(TCGType)((ulong)*(undefined8 *)pTVar1 >> 0x10) & 0xff,
                  vece,a_00,a_01);
  return;
}

Assistant:

void tcg_gen_dup_i32_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_i32 a)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGArg ai = tcgv_i32_arg(tcg_ctx, a);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

    vec_gen_2(tcg_ctx, INDEX_op_dup_vec, type, vece, ri, ai);
}